

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_log.cpp
# Opt level: O0

void __thiscall Kumu::StdioLogSink::WriteEntry(StdioLogSink *this,LogEntry *Entry)

{
  bool bVar1;
  char *__s;
  AutoMutex local_40;
  AutoMutex L;
  string buf;
  LogEntry *Entry_local;
  StdioLogSink *this_local;
  
  std::__cxx11::string::string((string *)&L);
  AutoMutex::AutoMutex(&local_40,&(this->super_ILogSink).m_lock);
  ILogSink::WriteEntryToListeners(&this->super_ILogSink,Entry);
  bVar1 = LogEntry::TestFilter(Entry,(this->super_ILogSink).m_filter);
  if (bVar1) {
    LogEntry::CreateStringWithOptions(Entry,(string *)&L,(this->super_ILogSink).m_options);
    __s = (char *)std::__cxx11::string::c_str();
    fputs(__s,(FILE *)this->m_stream);
    fflush((FILE *)this->m_stream);
  }
  AutoMutex::~AutoMutex(&local_40);
  std::__cxx11::string::~string((string *)&L);
  return;
}

Assistant:

void
Kumu::StdioLogSink::WriteEntry(const LogEntry& Entry)
{
  std::string buf;
  AutoMutex L(m_lock);
  WriteEntryToListeners(Entry);

  if ( Entry.TestFilter(m_filter) )
    {
      Entry.CreateStringWithOptions(buf, m_options);
      fputs(buf.c_str(), m_stream);
      fflush(m_stream);
    }
}